

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

bool __thiscall
ON_CheckSum::SetBufferCheckSum(ON_CheckSum *this,size_t size,void *buffer,time_t time)

{
  uchar *local_60;
  int local_4c;
  uchar *puStack_48;
  int i;
  uchar *p;
  size_t maxsize;
  size_t sz;
  ON__INT32 crc;
  bool rc;
  time_t time_local;
  void *buffer_local;
  size_t size_local;
  ON_CheckSum *this_local;
  
  Zero(this);
  if ((size == 0) || (buffer == (void *)0x0)) {
    sz._7_1_ = size == 0;
  }
  else {
    this->m_size = size & 0xffffffff;
    sz._0_4_ = 0;
    p = (uchar *)0x40000;
    puStack_48 = (uchar *)buffer;
    buffer_local = (void *)size;
    for (local_4c = 0; local_4c < 7; local_4c = local_4c + 1) {
      if (buffer_local != (void *)0x0) {
        if (p < buffer_local) {
          local_60 = p;
        }
        else {
          local_60 = (uchar *)buffer_local;
        }
        sz._0_4_ = ON_CRC32((ON__UINT32)sz,(size_t)local_60,puStack_48);
        puStack_48 = local_60 + (long)puStack_48;
        buffer_local = (void *)((long)buffer_local - (long)local_60);
        p = (uchar *)((long)p << 1);
      }
      this->m_crc[local_4c] = (ON__UINT32)sz;
    }
    if (buffer_local != (void *)0x0) {
      sz._0_4_ = ON_CRC32((ON__UINT32)sz,(size_t)buffer_local,puStack_48);
    }
    this->m_crc[7] = (ON__UINT32)sz;
    sz._7_1_ = true;
  }
  this->m_time = time;
  return sz._7_1_;
}

Assistant:

bool ON_CheckSum::SetBufferCheckSum( 
                size_t size, 
                const void* buffer,
                time_t time
               )
{
  bool rc = false;
  Zero();
  if ( size != 0 && buffer != 0 )
  {
    m_size = (unsigned int)size;

    ON__INT32 crc = 0;
    size_t sz, maxsize = 0x40000;
    const unsigned char* p = (const unsigned char*)buffer;
    for ( int i = 0; i < 7; i++ )
    {
      if ( size > 0 )
      {
        sz = (size > maxsize) ? maxsize : size;
        crc = ON_CRC32(crc,sz,p);
        p += sz;
        size -= sz;
        maxsize *= 2;
      }
      m_crc[i] = crc;
    }
    if ( size > 0 )
    {
      crc = ON_CRC32(crc,size,p);
    }
    m_crc[7] = crc;
    rc = true;
  }
  else if ( 0 == size )
  {
    rc = true;
  }
  m_time = time;
  return rc;
}